

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter_impl.h
# Opt level: O2

void __thiscall
lwlog::details::formatter::format_attribute<std::basic_string_view<char,std::char_traits<char>>>
          (formatter *this,string *pattern,flag_pair *flags,
          basic_string_view<char,_std::char_traits<char>_> value)

{
  char *pcVar1;
  _If_sv<std::basic_string_view<char>,_size_type> _Var2;
  string str_value;
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,(char *)value._M_len,&local_41);
  while( true ) {
    pcVar1 = strstr((char *)this->_vptr_formatter,(char *)pattern->_M_string_length);
    if (pcVar1 == (char *)0x0) break;
    _Var2 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)pattern,0)
    ;
    std::__cxx11::string::replace((ulong)this,_Var2,(string *)(pattern->_M_dataplus)._M_p);
  }
  while( true ) {
    pcVar1 = strstr((char *)this->_vptr_formatter,*(char **)((long)&pattern->field_2 + 8));
    if (pcVar1 == (char *)0x0) break;
    _Var2 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)this,
                       (basic_string_view<char,_std::char_traits<char>_> *)&pattern->field_2,0);
    std::__cxx11::string::replace
              ((ulong)this,_Var2,(string *)(pattern->field_2)._M_allocated_capacity);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void formatter::format_attribute(std::string& pattern, const flag_pair& flags, T value)
	{
		const std::string str_value = [&value]() {
			if constexpr (std::is_arithmetic_v<T>)					return std::to_string(value);
			else if constexpr (std::is_same_v<T, std::string>)		return value;
			else if constexpr (std::is_same_v<T, std::string_view>)	return value.data();
			else if constexpr (std::is_same_v<T, const char*>)		return value;
			else													return "";
		}();

		const auto& [verbose, shortened] = flags;
		while (std::strstr(pattern.data(), verbose.data()))
		{
			pattern.replace(pattern.find(verbose), verbose.length(), str_value);
		}

		while (std::strstr(pattern.data(), shortened.data()))
		{
			pattern.replace(pattern.find(shortened), shortened.length(), str_value);
		}
	}